

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O0

bool_t gf2QSolve(word *x,word *a,word *b,qr_o *f,void *stack)

{
  bool_t bVar1;
  void *stack_00;
  qr_o *in_RCX;
  ulong uVar2;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *in_R8;
  word *t;
  size_t m;
  ulong uVar3;
  qr_o *f_00;
  bool_t local_4;
  
  stack_00 = (void *)gf2Deg(in_RCX);
  f_00 = (qr_o *)(in_R8 + in_RCX->n);
  bVar1 = wwIsZero(in_RSI,in_RCX->n);
  if (bVar1 == 0) {
    bVar1 = wwIsZero(in_RDX,in_RCX->n);
    if (bVar1 == 0) {
      (*in_RCX->sqr)(in_R8,in_RSI,in_RCX,f_00);
      (*in_RCX->div)(in_R8,in_RDX,in_R8,in_RCX,f_00);
      bVar1 = gf2Tr((word *)in_RCX,f_00,stack_00);
      if (bVar1 == 0) {
        wwCopy(in_RDI,in_R8,in_RCX->n);
        uVar3 = (long)stack_00 - 1U >> 1;
        while (uVar2 = uVar3 - 1, uVar3 != 0) {
          (*in_RCX->sqr)(in_RDI,in_RDI,in_RCX,f_00);
          (*in_RCX->sqr)(in_RDI,in_RDI,in_RCX,f_00);
          wwXor2(in_RDI,in_R8,in_RCX->n);
          uVar3 = uVar2;
        }
        (*in_RCX->mul)(in_RDI,in_RDI,in_RSI,in_RCX,f_00);
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      wwSetZero(in_RDI,in_RCX->n);
      local_4 = 1;
    }
  }
  else {
    wwCopy(in_RDI,in_RDX,in_RCX->n);
    while (stack_00 = (void *)((long)stack_00 - 1), stack_00 != (void *)0x0) {
      (*in_RCX->sqr)(in_RDI,in_RDI,in_RCX,f_00);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

bool_t gf2QSolve(word x[], const word a[], const word b[],
	const qr_o* f, void* stack)
{
	size_t m = gf2Deg(f);
	word* t = (word*)stack;
	stack = t + f->n;
	// pre
	ASSERT(gf2IsOperable(f));
	ASSERT(gf2IsIn(a, f));
	ASSERT(gf2IsIn(b, f));
	ASSERT(x + f->n <= a || x >= a + f->n);
	ASSERT(m % 2);
	// a == 0?
	if (qrIsZero(a, f))
	{
		// x <- b^{2^{m - 1}}
		qrCopy(x, b, f);
		while (--m)
			qrSqr(x, x, f, stack);
		return TRUE;
	}
	// a != 0, b == 0?
	if (qrIsZero(b, f))
	{
		qrSetZero(x, f);
		return TRUE;
	}
	// t <- ba^{-2}
	qrSqr(t, a, f, stack);
	qrDiv(t, b, t, f, stack);
	// tr(t) == 1?
	if (gf2Tr(t, f, stack))
		return FALSE;
	// x <- htr(t) (полуслед)
	qrCopy(x, t, f);
	m = (m - 1) / 2;
	while (m--)
	{
		qrSqr(x, x, f, stack);
		qrSqr(x, x, f, stack);
		gf2Add2(x, t, f);
	}
	// x <- x * a
	qrMul(x, x, a, f, stack);
	// решение есть
	return TRUE;
}